

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObject.h
# Opt level: O1

bool __thiscall Js::DynamicObject::HasObjectArray(DynamicObject *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  bVar2 = IsAnyArray(this);
  if ((!bVar2) && (((ulong)this->field_1 & 1) != 0)) {
    bVar2 = IsObjectHeaderInlinedTypeHandler(this);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Types/DynamicObject.h"
                                  ,0xd1,
                                  "(DynamicObject::IsAnyArray((Var)this) || !UsesObjectArrayOrFlagsAsFlags() || IsObjectHeaderInlinedTypeHandler())"
                                  ,
                                  "DynamicObject::IsAnyArray((Var)this) || !UsesObjectArrayOrFlagsAsFlags() || IsObjectHeaderInlinedTypeHandler()"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
  }
  if ((this->field_1 == (anon_union_8_2_815e7e51_for_DynamicObject_2)0x0) ||
     (((ulong)this->field_1 & 1) != 0)) {
    bVar2 = false;
  }
  else {
    bVar2 = IsObjectHeaderInlinedTypeHandler(this);
    bVar2 = !bVar2;
  }
  return bVar2;
}

Assistant:

bool HasObjectArray() const
        {
            // Only JavascriptArray uses the objectArrayOrFlags as flags.
            Assert(DynamicObject::IsAnyArray((Var)this) || !UsesObjectArrayOrFlagsAsFlags() || IsObjectHeaderInlinedTypeHandler());
            return ((objectArray != nullptr) && !UsesObjectArrayOrFlagsAsFlags() && !IsObjectHeaderInlinedTypeHandler());
        }